

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

Ptr __thiscall core::image::byte_to_double_image(image *this,ConstPtr *image)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int chans;
  invalid_argument *this_00;
  TypedImageBase<double> *this_01;
  ImageBase *pIVar5;
  TypedImageBase<unsigned_char> *this_02;
  element_type *this_03;
  byte *pbVar6;
  double *pdVar7;
  element_type *this_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar8;
  double local_48;
  double local_40;
  double local_38;
  double value;
  undefined1 local_25;
  int i;
  ConstPtr *local_18;
  ConstPtr *image_local;
  Ptr *img;
  
  local_18 = image;
  image_local = (ConstPtr *)this;
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (bVar2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_25 = 0;
  Image<double>::create();
  this_01 = &std::__shared_ptr_access<core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<double>;
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar4 = ImageBase::height(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  chans = ImageBase::channels(pIVar5);
  TypedImageBase<double>::allocate(this_01,iVar3,iVar4,chans);
  value._4_4_ = 0;
  while( true ) {
    iVar3 = value._4_4_;
    this_02 = &std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<unsigned_char>;
    iVar4 = TypedImageBase<unsigned_char>::get_value_amount(this_02);
    if (iVar4 <= iVar3) break;
    this_03 = std::
              __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    pbVar6 = Image<unsigned_char>::at(this_03,value._4_4_);
    local_38 = (double)*pbVar6 / 255.0;
    local_40 = 1.0;
    local_48 = 0.0;
    pdVar7 = std::max<double>(&local_48,&local_38);
    pdVar7 = std::min<double>(&local_40,pdVar7);
    dVar1 = *pdVar7;
    this_04 = std::
              __shared_ptr_access<core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pdVar7 = Image<double>::at(this_04,value._4_4_);
    *pdVar7 = dVar1;
    value._4_4_ = value._4_4_ + 1;
  }
  PVar8.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DoubleImage::Ptr
byte_to_double_image (ByteImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    DoubleImage::Ptr img = DoubleImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        double value = static_cast<double>(image->at(i)) / 255.0;
        img->at(i) = std::min(1.0, std::max(0.0, value));
    }
    return img;
}